

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vta_ObjPreds(Vta_Man_t *p,Vta_Obj_t *pThis,Gia_Obj_t *pObj,Vta_Obj_t **ppThis0,
                 Vta_Obj_t **ppThis1)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  Vta_Obj_t *pVVar3;
  
  *ppThis0 = (Vta_Obj_t *)0x0;
  *ppThis1 = (Vta_Obj_t *)0x0;
  iVar1 = Gia_ObjIsPi(p->pGia,pObj);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ObjIsPi(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0x1bc,
                  "void Vta_ObjPreds(Vta_Man_t *, Vta_Obj_t *, Gia_Obj_t *, Vta_Obj_t **, Vta_Obj_t **)"
                 );
  }
  if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) &&
     ((uVar2 = (uint)*(ulong *)pObj, (~uVar2 & 0x9fffffff) != 0 || (pThis->iFrame != 0)))) {
    if ((~uVar2 & 0x1fffffff) == 0 || (int)uVar2 < 0) {
      iVar1 = Gia_ObjIsRo(p->pGia,pObj);
      if ((iVar1 == 0) || (pThis->iFrame < 1)) {
        __assert_fail("Gia_ObjIsRo(p->pGia, pObj) && pThis->iFrame > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                      ,0x1c6,
                      "void Vta_ObjPreds(Vta_Man_t *, Vta_Obj_t *, Gia_Obj_t *, Vta_Obj_t **, Vta_Obj_t **)"
                     );
      }
      pObj_00 = Gia_ObjRoToRi(p->pGia,pObj);
      iVar1 = Gia_ObjFaninId0p(p->pGia,pObj_00);
      pVVar3 = Vga_ManFind(p,iVar1,pThis->iFrame + -1);
      *ppThis0 = pVVar3;
    }
    else {
      iVar1 = Gia_ObjFaninId0p(p->pGia,pObj);
      pVVar3 = Vga_ManFind(p,iVar1,pThis->iFrame);
      *ppThis0 = pVVar3;
      iVar1 = Gia_ObjFaninId1p(p->pGia,pObj);
      pVVar3 = Vga_ManFind(p,iVar1,pThis->iFrame);
      *ppThis1 = pVVar3;
    }
  }
  return;
}

Assistant:

static inline void Vta_ObjPreds( Vta_Man_t * p, Vta_Obj_t * pThis, Gia_Obj_t * pObj, Vta_Obj_t ** ppThis0, Vta_Obj_t ** ppThis1 )
{
    *ppThis0 = NULL;
    *ppThis1 = NULL;
//    if ( !pThis->fAdded )
//        return;
    assert( !Gia_ObjIsPi(p->pGia, pObj) );
    if ( Gia_ObjIsConst0(pObj) || (Gia_ObjIsCi(pObj) && pThis->iFrame == 0) )
        return;
    if ( Gia_ObjIsAnd(pObj) )
    {
        *ppThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
        *ppThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
//        assert( *ppThis0 && *ppThis1 );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) && pThis->iFrame > 0 );
    pObj = Gia_ObjRoToRi( p->pGia, pObj );
    *ppThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
//    assert( *ppThis0 );
}